

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O0

saint_t divsufsort(sauchar_t *T,saidx_t *SA,saidx_t n)

{
  byte bVar1;
  byte bVar2;
  saidx_t m_00;
  saidx_t *bucket_A_00;
  saidx_t *bucket_B_00;
  int in_EDX;
  saidx_t *in_RSI;
  byte *in_RDI;
  saint_t err;
  saidx_t m;
  saidx_t *bucket_B;
  saidx_t *bucket_A;
  saidx_t *in_stack_00000030;
  saidx_t *in_stack_00000038;
  sauchar_t *in_stack_00000040;
  saint_t local_38;
  saint_t local_4;
  
  local_38 = 0;
  if (((in_RDI == (byte *)0x0) || (in_RSI == (saidx_t *)0x0)) || (in_EDX < 0)) {
    local_4 = -1;
  }
  else if (in_EDX == 0) {
    local_4 = 0;
  }
  else if (in_EDX == 1) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else if (in_EDX == 2) {
    bVar1 = *in_RDI;
    bVar2 = in_RDI[1];
    in_RSI[(int)(bVar1 < bVar2 ^ 1)] = 0;
    in_RSI[(int)(uint)(bVar1 < bVar2)] = 1;
    local_4 = 0;
  }
  else {
    bucket_A_00 = (saidx_t *)malloc(0x400);
    bucket_B_00 = (saidx_t *)malloc(0x40000);
    if ((bucket_A_00 == (saidx_t *)0x0) || (bucket_B_00 == (saidx_t *)0x0)) {
      local_38 = -2;
    }
    else {
      m_00 = sort_typeBstar(in_stack_00000040,in_stack_00000038,in_stack_00000030,(saidx_t *)T,
                            SA._4_4_);
      construct_SA(in_RDI,in_RSI,bucket_A_00,bucket_B_00,in_EDX,m_00);
    }
    free(bucket_B_00);
    free(bucket_A_00);
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

saint_t
divsufsort(const sauchar_t *T, saidx_t *SA, saidx_t n) {
  saidx_t *bucket_A, *bucket_B;
  saidx_t m;
  saint_t err = 0;

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) { return -1; }
  else if(n == 0) { return 0; }
  else if(n == 1) { SA[0] = 0; return 0; }
  else if(n == 2) { m = (T[0] < T[1]); SA[m ^ 1] = 0, SA[m] = 1; return 0; }

  bucket_A = (saidx_t *)malloc(BUCKET_A_SIZE * sizeof(saidx_t));
  bucket_B = (saidx_t *)malloc(BUCKET_B_SIZE * sizeof(saidx_t));

  /* Suffixsort. */
  if((bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, SA, bucket_A, bucket_B, n);
    construct_SA(T, SA, bucket_A, bucket_B, n, m);
  } else {
    err = -2;
  }

  free(bucket_B);
  free(bucket_A);

  return err;
}